

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

Validity * __thiscall kj::TestRunner::run(Validity *__return_storage_ptr__,TestRunner *this)

{
  ProcessContext *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  kj kVar5;
  int iVar6;
  TestRunner *pTVar7;
  long lVar8;
  long lVar9;
  _func_int **pp_Var10;
  TestRunner *params_1;
  TestRunner *pTVar11;
  _func_int *p_Var12;
  _func_int **pp_Var13;
  char *pcVar14;
  char *ptrCopy;
  bool currentFailed;
  uint failCount;
  uint passCount;
  String name;
  String message;
  char **in_stack_fffffffffffffc98;
  char local_359;
  int local_358;
  int local_354;
  TestRunner *local_350;
  String local_348;
  ArrayDisposer local_330;
  Runnable local_328;
  TestRunner *pTStack_320;
  ArrayDisposer *local_318;
  char *local_310;
  long local_300;
  undefined1 local_2f8 [16];
  ArrayDisposer *local_2e8;
  ArrayDisposer *pAStack_2e0;
  char *local_2d8;
  undefined8 uStack_2d0;
  char *local_2c8;
  size_t sStack_2c0;
  ArrayDisposer *local_2b8;
  Disposer *pDStack_2b0;
  Context *local_2a8;
  undefined1 local_2a0 [272];
  Maybe<kj::Exception> local_190;
  
  pp_Var13 = (anonymous_namespace)::testCasesHead;
  if ((anonymous_namespace)::testCasesHead == (_func_int **)0x0) {
    heapString((String *)local_2f8,"no tests were declared",0x16);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = (char *)local_2f8._0_8_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_2f8._8_8_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_2e8;
    return __return_storage_ptr__;
  }
  p_Var12 = (anonymous_namespace)::testCasesHead[1];
  pTVar7 = (TestRunner *)strlen((char *)p_Var12);
  local_350 = (TestRunner *)0x0;
  pp_Var10 = pp_Var13;
  do {
    while (pTVar7 != (TestRunner *)0x0) {
      pTVar11 = (TestRunner *)0x0;
      do {
        params_1 = pTVar11;
        if (pp_Var10[1][(long)pTVar11] != p_Var12[(long)pTVar11]) break;
        pTVar11 = (TestRunner *)((long)&pTVar11->context + 1);
        params_1 = pTVar7;
      } while (pTVar7 != pTVar11);
      pp_Var10 = (_func_int **)pp_Var10[4];
      pTVar7 = params_1;
      if (pp_Var10 == (_func_int **)0x0) {
        pTVar7 = (TestRunner *)0x0;
        goto joined_r0x0016e0f0;
      }
    }
    pp_Var10 = (_func_int **)pp_Var10[4];
    pTVar7 = (TestRunner *)0x0;
  } while (pp_Var10 != (_func_int **)0x0);
  params_1 = (TestRunner *)0x0;
LAB_0016e11a:
  local_354 = 0;
  local_358 = 0;
  local_330._vptr_ArrayDisposer = pp_Var13;
  pTVar7 = local_350;
  do {
    if ((this->hasFilter != true) || (*(char *)(local_330._vptr_ArrayDisposer + 6) == '\x01')) {
      local_2f8._0_8_ = local_330._vptr_ArrayDisposer[1] + (long)pTVar7;
      local_190.ptr.isSet = true;
      str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
                (&local_348,(kj *)local_2f8,(char **)&local_190,
                 (char *)(local_330._vptr_ArrayDisposer + 2),(uint *)0x191174,
                 (char (*) [3])(local_330._vptr_ArrayDisposer + 3),in_stack_fffffffffffffc98);
      pcVar14 = (char *)((long)(ProcessContext **)local_348.content.size_ +
                        (ulong)((TestRunner *)local_348.content.size_ == (TestRunner *)0x0));
      params_1 = (TestRunner *)0x9;
      write(this,2,"[ TEST ]",9);
      if (this->listOnly == false) {
        local_359 = '\x01';
        lVar8 = ::std::chrono::_V2::steady_clock::now();
        local_328._vptr_Runnable = (_func_int **)&PTR_run_001ba290;
        local_310 = &local_359;
        pTStack_320 = this;
        local_318 = &local_330;
        _::runCatchingExceptions(&local_190,&local_328);
        local_2f8[0] = (kj)local_190.ptr.isSet;
        kVar5 = (kj)local_190.ptr.isSet;
        if ((kj)local_190.ptr.isSet == (kj)0x1) {
          local_2f8._8_8_ = local_190.ptr.field_1.value.ownFile.content.ptr;
          local_2e8 = (ArrayDisposer *)local_190.ptr.field_1.value.ownFile.content.size_;
          pAStack_2e0 = local_190.ptr.field_1.value.ownFile.content.disposer;
          local_190.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
          local_190.ptr.field_1.value.ownFile.content.size_ = 0;
          local_2d8 = local_190.ptr.field_1.value.file;
          uStack_2d0 = local_190.ptr.field_1._32_8_;
          local_2c8 = local_190.ptr.field_1.value.description.content.ptr;
          sStack_2c0 = local_190.ptr.field_1.value.description.content.size_;
          local_190.ptr.field_1.value.description.content.ptr = (char *)0x0;
          local_190.ptr.field_1.value.description.content.size_ = 0;
          local_2b8 = local_190.ptr.field_1.value.description.content.disposer;
          pDStack_2b0 = local_190.ptr.field_1.value.context.ptr.disposer;
          local_2a8 = local_190.ptr.field_1.value.context.ptr.ptr;
          local_190.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
          memcpy(local_2a0,(undefined1 *)((long)&local_190.ptr.field_1.value + 0x50),0x104);
          Exception::~Exception((Exception *)&local_190.ptr.field_1);
          kVar5 = local_2f8[0];
        }
        if (((byte)kVar5 & 1) != 0) {
          pPVar1 = this->context;
          local_300 = lVar8;
          kj::operator*(&local_190,local_2f8 + 8);
          uVar4 = local_190.ptr.field_1.value.ownFile.content.size_;
          uVar3 = local_190.ptr.field_1.value.ownFile.content.ptr;
          uVar2 = local_190.ptr._0_8_;
          local_328._vptr_Runnable = (_func_int **)local_190.ptr._0_8_;
          pTStack_320 = (TestRunner *)local_190.ptr.field_1.value.ownFile.content.ptr;
          local_318 = (ArrayDisposer *)local_190.ptr.field_1.value.ownFile.content.size_;
          pp_Var13 = (_func_int **)local_190.ptr._0_8_;
          if ((TestRunner *)local_190.ptr.field_1.value.ownFile.content.ptr == (TestRunner *)0x0) {
            pp_Var13 = (_func_int **)0x199111;
          }
          (*pPVar1->_vptr_ProcessContext[3])
                    (pPVar1,pp_Var13,
                     local_190.ptr.field_1.value.ownFile.content.ptr +
                     ((TestRunner *)local_190.ptr.field_1.value.ownFile.content.ptr ==
                     (TestRunner *)0x0));
          if ((_func_int **)uVar2 != (_func_int **)0x0) {
            local_328._vptr_Runnable = (_func_int **)0x0;
            pTStack_320 = (TestRunner *)0x0;
            pcVar14 = (char *)0x0;
            (***(_func_int ***)uVar4)(uVar4,uVar2,1,uVar3,uVar3);
          }
          lVar8 = local_300;
          pTVar7 = local_350;
          kVar5 = local_2f8[0];
        }
        if (((byte)kVar5 & 1) != 0) {
          Exception::~Exception((Exception *)(local_2f8 + 8));
        }
        lVar9 = ::std::chrono::_V2::steady_clock::now();
        local_190.ptr._0_8_ = (lVar9 - lVar8) / 1000;
        str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
                  ((String *)local_2f8,(kj *)&local_348,(String *)" (",(char (*) [3])&local_190,
                   (long *)anon_var_dwarf_12aded,(char (*) [6])pcVar14);
        if (local_359 == '\x01') {
          params_1 = (TestRunner *)0x9;
          write(this,0,"[ FAIL ]",9);
          local_358 = local_358 + 1;
        }
        else {
          params_1 = (TestRunner *)0x9;
          write(this,1,"[ PASS ]",9);
          local_354 = local_354 + 1;
        }
        pTVar11 = (TestRunner *)local_2f8._8_8_;
        uVar2 = local_2f8._0_8_;
        if ((_func_int *)local_2f8._0_8_ != (_func_int *)0x0) {
          local_2f8._0_8_ = (_func_int *)0x0;
          local_2f8._8_8_ = (TestRunner *)0x0;
          (**local_2e8->_vptr_ArrayDisposer)(local_2e8,uVar2,1,pTVar11,pTVar11,0);
          params_1 = pTVar11;
        }
      }
      pTVar11 = (TestRunner *)local_348.content.size_;
      pcVar14 = local_348.content.ptr;
      if (local_348.content.ptr != (char *)0x0) {
        local_348.content.ptr = (char *)0x0;
        local_348.content.size_ = 0;
        (**(local_348.content.disposer)->_vptr_ArrayDisposer)
                  (local_348.content.disposer,pcVar14,1,pTVar11,pTVar11,0);
        params_1 = pTVar11;
      }
    }
    local_330._vptr_ArrayDisposer = (_func_int **)local_330._vptr_ArrayDisposer[4];
  } while (local_330._vptr_ArrayDisposer != (_func_int **)0x0);
  if (local_354 != 0) {
    str<unsigned_int&,char_const(&)[16]>
              ((String *)local_2f8,(kj *)&local_354,(uint *)" test(s) passed",
               (char (*) [16])params_1);
    p_Var12 = (_func_int *)0x199111;
    if ((TestRunner *)local_2f8._8_8_ != (TestRunner *)0x0) {
      p_Var12 = (_func_int *)local_2f8._0_8_;
    }
    params_1 = (TestRunner *)
               ((long)(ProcessContext **)local_2f8._8_8_ +
               (ulong)((TestRunner *)local_2f8._8_8_ == (TestRunner *)0x0));
    write(this,1,p_Var12,(size_t)params_1);
    String::~String((String *)local_2f8);
  }
  if (local_358 != 0) {
    str<unsigned_int&,char_const(&)[16]>
              ((String *)local_2f8,(kj *)&local_358,(uint *)" test(s) failed",
               (char (*) [16])params_1);
    p_Var12 = (_func_int *)0x199111;
    if ((TestRunner *)local_2f8._8_8_ != (TestRunner *)0x0) {
      p_Var12 = (_func_int *)local_2f8._0_8_;
    }
    write(this,0,p_Var12,
          (size_t)((long)(ProcessContext **)local_2f8._8_8_ +
                  (ulong)((TestRunner *)local_2f8._8_8_ == (TestRunner *)0x0)));
    String::~String((String *)local_2f8);
  }
  iVar6 = (*this->context->_vptr_ProcessContext[1])();
  __clang_call_terminate(iVar6);
joined_r0x0016e0f0:
  if (params_1 == (TestRunner *)0x0) goto LAB_0016e10a;
  local_350 = params_1;
  if (((p_Var12 + -1)[(long)params_1] == (_func_int)0x2f) ||
     ((p_Var12 + -1)[(long)params_1] == (_func_int)0x5c)) goto LAB_0016e11a;
  params_1 = (TestRunner *)&params_1[-1].field_0xf;
  pTVar7 = params_1;
  goto joined_r0x0016e0f0;
LAB_0016e10a:
  local_350 = (TestRunner *)0x0;
  params_1 = pTVar7;
  goto LAB_0016e11a;
}

Assistant:

MainBuilder::Validity run() {
    if (testCasesHead == nullptr) {
      return "no tests were declared";
    }

    // Find the common path prefix of all filenames, so we can strip it off.
    ArrayPtr<const char> commonPrefix = StringPtr(testCasesHead->file);
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      for (size_t i: kj::indices(commonPrefix)) {
        if (testCase->file[i] != commonPrefix[i]) {
          commonPrefix = commonPrefix.slice(0, i);
          break;
        }
      }
    }

    // Back off the prefix to the last '/'.
    while (commonPrefix.size() > 0 && commonPrefix.back() != '/' && commonPrefix.back() != '\\') {
      commonPrefix = commonPrefix.slice(0, commonPrefix.size() - 1);
    }

    // Run the testts.
    uint passCount = 0;
    uint failCount = 0;
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!hasFilter || testCase->matchedFilter) {
        auto name = kj::str(testCase->file + commonPrefix.size(), ':', testCase->line,
                            ": ", testCase->description);

        write(BLUE, "[ TEST ]", name);

        if (!listOnly) {
          bool currentFailed = true;
          auto start = readClock();
          KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
            TestExceptionCallback exceptionCallback(context);
            testCase->run();
            currentFailed = exceptionCallback.failed();
          })) {
            context.error(kj::str(*exception));
          }
          auto end = readClock();

          auto message = kj::str(name, " (", (end - start) / kj::MICROSECONDS, " μs)");

          if (currentFailed) {
            write(RED, "[ FAIL ]", message);
            ++failCount;
          } else {
            write(GREEN, "[ PASS ]", message);
            ++passCount;
          }
        }
      }
    }

    if (passCount > 0) write(GREEN, kj::str(passCount, " test(s) passed"), "");
    if (failCount > 0) write(RED, kj::str(failCount, " test(s) failed"), "");
    context.exit();

    KJ_UNREACHABLE;
  }